

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O3

int Path::glob(char *__pattern,int __flags,__errfunc *__errfunc,glob_t *__pglob)

{
  int iVar1;
  undefined4 in_register_00000034;
  long lVar2;
  int i;
  long lVar3;
  glob_t g;
  glob_t local_60;
  
  __pattern[0] = '\0';
  __pattern[1] = '\0';
  __pattern[2] = '\0';
  __pattern[3] = '\0';
  __pattern[4] = '\0';
  __pattern[5] = '\0';
  __pattern[6] = '\0';
  __pattern[7] = '\0';
  __pattern[8] = '\0';
  __pattern[9] = '\0';
  __pattern[10] = '\0';
  __pattern[0xb] = '\0';
  __pattern[0xc] = '\0';
  __pattern[0xd] = '\0';
  __pattern[0xe] = '\0';
  __pattern[0xf] = '\0';
  __pattern[0x10] = '\0';
  __pattern[0x11] = '\0';
  __pattern[0x12] = '\0';
  __pattern[0x13] = '\0';
  __pattern[0x14] = '\0';
  __pattern[0x15] = '\0';
  __pattern[0x16] = '\0';
  __pattern[0x17] = '\0';
  iVar1 = ::glob(*(char **)CONCAT44(in_register_00000034,__flags),0x1401,(__errfunc *)0x0,&local_60)
  ;
  if ((iVar1 == 0) && (0 < (int)local_60.gl_pathc)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)__pattern,
                 (char **)((long)local_60.gl_pathv + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar3 < (int)local_60.gl_pathc);
  }
  globfree(&local_60);
  return (int)__pattern;
}

Assistant:

std::vector <std::string> Path::glob (const std::string& pattern)
{
  std::vector <std::string> results;

  glob_t g;
#ifdef SOLARIS
  if (!::glob (pattern.c_str (), GLOB_ERR, nullptr, &g))
#else
  if (!::glob (pattern.c_str (), GLOB_ERR | GLOB_BRACE | GLOB_TILDE, nullptr, &g))
#endif
    for (int i = 0; i < (int) g.gl_pathc; ++i)
      results.emplace_back (g.gl_pathv[i]);

  globfree (&g);
  return results;
}